

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O1

bool __thiscall wallet::CWallet::MigrateToSQLite(CWallet *this,bilingual_str *error)

{
  undefined1 *puVar1;
  WalletDatabase *pWVar2;
  undefined1 *puVar3;
  WalletDatabase *pWVar4;
  pointer ppVar5;
  long *plVar6;
  DatabaseBatch *pDVar7;
  _Alloc_hider _Var8;
  bool bVar9;
  int iVar10;
  pointer ppVar11;
  long in_FS_OFFSET;
  unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> new_db;
  DatabaseStatus db_status;
  vector<std::pair<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::allocator<std::pair<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  records;
  unique_ptr<wallet::DatabaseCursor,_std::default_delete<wallet::DatabaseCursor>_> cursor;
  unique_ptr<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_> batch;
  DatabaseOptions opts;
  SerializeData value;
  path wallet_path;
  path db_path;
  WalletDatabase *local_178;
  DatabaseStatus local_16c;
  vector<std::pair<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::allocator<std::pair<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  local_168;
  long *local_148;
  DatabaseBatch *local_140;
  undefined1 local_138 [24];
  undefined1 auStack_120 [16];
  undefined1 local_110 [16];
  undefined2 local_100;
  bool local_fe;
  int64_t local_f8;
  path local_f0;
  path local_c8;
  path local_98;
  path local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  WalletLogPrintf<>(this,"Migrating wallet storage database from BerkeleyDB to SQLite.\n");
  (*((this->m_database)._M_t.
     super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>.
     _M_t.
     super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>.
     super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl)->_vptr_WalletDatabase[0xd]
  )((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138);
  iVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138
                      ,"sqlite");
  puVar3 = (undefined1 *)CONCAT44(local_138._4_4_,CONCAT22(local_138._2_2_,local_138._0_2_));
  puVar1 = local_138 + 0x10;
  if (puVar3 != puVar1) {
    operator_delete(puVar3,local_138._16_8_ + 1);
  }
  local_138._0_2_ = SUB82(puVar1,0);
  local_138._2_2_ = (undefined2)((ulong)puVar1 >> 0x10);
  local_138._4_4_ = (undefined4)((ulong)puVar1 >> 0x20);
  if (iVar10 == 0) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_138,"Error: This wallet already uses SQLite","");
    if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
      auStack_120._8_8_ = local_110 + 8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(auStack_120 + 8),"Error: This wallet already uses SQLite","");
    }
    else {
      local_68._M_pathname._M_dataplus._M_p = "Error: This wallet already uses SQLite";
      (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (auStack_120 + 8),(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)&local_68);
    }
    MigrateToSQLite();
    bVar9 = false;
    goto LAB_00c57345;
  }
  pWVar2 = (this->m_database)._M_t.
           super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
           ._M_t.
           super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
           .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl;
  (*pWVar2->_vptr_WalletDatabase[0xe])(&local_140,pWVar2,1);
  (*local_140->_vptr_DatabaseBatch[9])(&local_148);
  local_168.
  super__Vector_base<std::pair<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::allocator<std::pair<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.
  super__Vector_base<std::pair<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::allocator<std::pair<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.
  super__Vector_base<std::pair<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::allocator<std::pair<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_148 == (long *)0x0) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_138,"Error: Unable to begin reading all records in the database","");
    if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
      auStack_120._8_8_ = (long)local_110 + 8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(auStack_120 + 8),
                 "Error: Unable to begin reading all records in the database","");
    }
    else {
      local_68._M_pathname._M_dataplus._M_p =
           "Error: Unable to begin reading all records in the database";
      (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (auStack_120 + 8),(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)&local_68);
    }
    MigrateToSQLite();
LAB_00c574fc:
    bVar9 = false;
  }
  else {
    while( true ) {
      local_138._16_8_ = 0;
      auStack_120._0_8_ = (undefined1 *)0x0;
      local_138[0] = false;
      local_138[1] = false;
      local_138._2_2_ = 0;
      local_138._4_4_ = BERKELEY;
      local_138._8_4_ = 0;
      local_138._12_4_ = 0;
      local_68._M_pathname.field_2._M_allocated_capacity = 0;
      local_68._M_pathname.field_2._8_8_ = 0;
      local_68._M_pathname._M_dataplus._M_p = (char *)0x0;
      local_68._M_pathname._M_string_length = 0;
      iVar10 = (**(code **)(*local_148 + 0x10))
                         (local_148,
                          (_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)
                          local_138,&local_68);
      if (iVar10 != 1) break;
      local_98._M_pathname._M_dataplus._M_p = (pointer)0x0;
      local_98._M_pathname._M_string_length = 0;
      local_98._M_pathname.field_2._M_allocated_capacity = 0;
      std::vector<std::byte,zero_after_free_allocator<std::byte>>::
      _M_range_initialize<__gnu_cxx::__normal_iterator<std::byte*,std::vector<std::byte,zero_after_free_allocator<std::byte>>>>
                ((vector<std::byte,zero_after_free_allocator<std::byte>> *)&local_98,
                 (undefined1 *)
                 (CONCAT44(local_138._4_4_,CONCAT22(local_138._2_2_,local_138._0_2_)) +
                 auStack_120._0_8_),CONCAT44(local_138._12_4_,local_138._8_4_));
      local_c8._M_pathname._M_dataplus._M_p = (pointer)0x0;
      local_c8._M_pathname._M_string_length = 0;
      local_c8._M_pathname.field_2._M_allocated_capacity = 0;
      std::vector<std::byte,zero_after_free_allocator<std::byte>>::
      _M_range_initialize<__gnu_cxx::__normal_iterator<std::byte*,std::vector<std::byte,zero_after_free_allocator<std::byte>>>>
                ((vector<std::byte,zero_after_free_allocator<std::byte>> *)&local_c8,
                 local_68._M_pathname._M_dataplus._M_p + local_68._M_pathname.field_2._8_8_,
                 local_68._M_pathname._M_string_length);
      std::
      vector<std::pair<std::vector<std::byte,zero_after_free_allocator<std::byte>>,std::vector<std::byte,zero_after_free_allocator<std::byte>>>,std::allocator<std::pair<std::vector<std::byte,zero_after_free_allocator<std::byte>>,std::vector<std::byte,zero_after_free_allocator<std::byte>>>>>
      ::
      emplace_back<std::vector<std::byte,zero_after_free_allocator<std::byte>>&,std::vector<std::byte,zero_after_free_allocator<std::byte>>&>
                ((vector<std::pair<std::vector<std::byte,zero_after_free_allocator<std::byte>>,std::vector<std::byte,zero_after_free_allocator<std::byte>>>,std::allocator<std::pair<std::vector<std::byte,zero_after_free_allocator<std::byte>>,std::vector<std::byte,zero_after_free_allocator<std::byte>>>>>
                  *)&local_168,(vector<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_98
                 ,(vector<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_c8);
      std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_c8);
      std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_98);
      std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_68);
      std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)local_138);
    }
    std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
              ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_68);
    std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
              ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)local_138);
    plVar6 = local_148;
    local_148 = (long *)0x0;
    if (plVar6 != (long *)0x0) {
      (**(code **)(*plVar6 + 8))();
    }
    pDVar7 = local_140;
    local_140 = (DatabaseBatch *)0x0;
    if (pDVar7 != (DatabaseBatch *)0x0) {
      (*pDVar7->_vptr_DatabaseBatch[5])();
    }
    if (iVar10 != 2) {
      puVar1 = local_138 + 0x10;
      local_138._0_2_ = SUB82(puVar1,0);
      local_138._2_2_ = (undefined2)((ulong)puVar1 >> 0x10);
      local_138._4_4_ = (undefined4)((ulong)puVar1 >> 0x20);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_138,"Error: Unable to read all records in the database","");
      if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
        auStack_120._8_8_ = (long)local_110 + 8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(auStack_120 + 8),"Error: Unable to read all records in the database",
                   "");
      }
      else {
        local_68._M_pathname._M_dataplus._M_p = "Error: Unable to read all records in the database";
        (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (auStack_120 + 8),(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)&local_68);
      }
      MigrateToSQLite();
      goto LAB_00c574fc;
    }
    (*((this->m_database)._M_t.
       super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>.
       _M_t.
       super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
       .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl)->_vptr_WalletDatabase
      [0xc])(&local_98);
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              ((path *)local_138,&local_98._M_pathname,auto_format);
    std::filesystem::__cxx11::path::path(&local_68,(path *)local_138);
    std::filesystem::__cxx11::path::~path((path *)local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_pathname._M_dataplus._M_p != &local_98._M_pathname.field_2) {
      operator_delete(local_98._M_pathname._M_dataplus._M_p,
                      local_98._M_pathname.field_2._M_allocated_capacity + 1);
    }
    (*((this->m_database)._M_t.
       super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>.
       _M_t.
       super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
       .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl)->_vptr_WalletDatabase
      [8])();
    std::filesystem::remove((path *)&local_68);
    GetWalletDir();
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              ((path *)local_138,&this->m_name,auto_format);
    std::filesystem::__cxx11::path::path(&local_f0,(path *)local_138);
    std::filesystem::__cxx11::path::~path((path *)local_138);
    fsbridge::AbsPathJoin((path *)&local_98,(path *)&local_c8,(path *)&local_f0);
    std::filesystem::__cxx11::path::~path(&local_f0);
    std::filesystem::__cxx11::path::~path(&local_c8);
    local_138[0] = false;
    local_138[1] = true;
    local_138._16_8_ = 0;
    auStack_120._8_8_ =
         (__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
          )0x0;
    local_110[0] = '\0';
    local_100._0_1_ = true;
    local_100._1_1_ = false;
    local_fe = false;
    local_f8 = 100;
    local_138._4_4_ = SQLITE;
    local_138._8_4_ = 1;
    auStack_120._0_8_ = local_110;
    MakeDatabase((wallet *)&local_178,(path *)&local_98,(DatabaseOptions *)local_138,&local_16c,
                 error);
    if (local_178 == (WalletDatabase *)0x0) {
      __assert_fail("new_db",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
                    ,0xfaa,"bool wallet::CWallet::MigrateToSQLite(bilingual_str &)");
    }
    pWVar2 = (this->m_database)._M_t.
             super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
             ._M_t.
             super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
             .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl;
    (this->m_database)._M_t.
    super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>._M_t
    .super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>.
    super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl = (WalletDatabase *)0x0;
    if (pWVar2 != (WalletDatabase *)0x0) {
      (*pWVar2->_vptr_WalletDatabase[1])();
    }
    pWVar4 = local_178;
    local_178 = (WalletDatabase *)0x0;
    pWVar2 = (this->m_database)._M_t.
             super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
             ._M_t.
             super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
             .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl;
    (this->m_database)._M_t.
    super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>._M_t
    .super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>.
    super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl = pWVar4;
    if (pWVar2 != (WalletDatabase *)0x0) {
      (*pWVar2->_vptr_WalletDatabase[1])();
    }
    pWVar2 = (this->m_database)._M_t.
             super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
             ._M_t.
             super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
             .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl;
    (*pWVar2->_vptr_WalletDatabase[0xe])(&local_c8,pWVar2,1);
    _Var8._M_p = local_c8._M_pathname._M_dataplus._M_p;
    pDVar7 = local_140;
    local_c8._M_pathname._M_dataplus._M_p = (pointer)0x0;
    local_140 = (DatabaseBatch *)_Var8._M_p;
    if (pDVar7 != (DatabaseBatch *)0x0) {
      (*pDVar7->_vptr_DatabaseBatch[5])();
    }
    if ((DatabaseBatch *)local_c8._M_pathname._M_dataplus._M_p != (DatabaseBatch *)0x0) {
      (*(*(_func_int ***)local_c8._M_pathname._M_dataplus._M_p)[5])();
    }
    iVar10 = (*local_140->_vptr_DatabaseBatch[0xb])();
    ppVar5 = local_168.
             super__Vector_base<std::pair<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::allocator<std::pair<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((char)iVar10 == '\0') {
      __assert_fail("began",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
                    ,0xfb1,"bool wallet::CWallet::MigrateToSQLite(bilingual_str &)");
    }
    if (local_168.
        super__Vector_base<std::pair<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::allocator<std::pair<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_168.
        super__Vector_base<std::pair<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::allocator<std::pair<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      ppVar11 = local_168.
                super__Vector_base<std::pair<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::allocator<std::pair<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_c8._M_pathname._M_dataplus._M_p =
             (pointer)(ppVar11->first).
                      super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                      super__Vector_impl_data._M_start;
        local_c8._M_pathname._M_string_length =
             (long)(ppVar11->first).
                   super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)local_c8._M_pathname._M_dataplus._M_p;
        local_f0._M_pathname._M_dataplus._M_p =
             (pointer)(ppVar11->second).
                      super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                      super__Vector_impl_data._M_start;
        local_f0._M_pathname._M_string_length =
             (long)(ppVar11->second).
                   super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)local_f0._M_pathname._M_dataplus._M_p;
        bVar9 = DatabaseBatch::Write<Span<std::byte_const>,Span<std::byte_const>>
                          (local_140,(Span<const_std::byte> *)&local_c8,
                           (Span<const_std::byte> *)&local_f0,true);
        if (!bVar9) {
          (*local_140->_vptr_DatabaseBatch[0xd])();
          (*((this->m_database)._M_t.
             super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
             ._M_t.
             super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
             .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl)->
            _vptr_WalletDatabase[8])();
          (*((this->m_database)._M_t.
             super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
             ._M_t.
             super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
             .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl)->
            _vptr_WalletDatabase[0xc])(&local_f0);
          std::filesystem::__cxx11::path::path(&local_c8,&local_f0._M_pathname,auto_format);
          std::filesystem::remove((path *)&local_c8);
          std::filesystem::__cxx11::path::~path(&local_c8);
          std::__cxx11::string::~string((string *)&local_f0);
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
                        ,0xfb7,"bool wallet::CWallet::MigrateToSQLite(bilingual_str &)");
        }
        ppVar11 = ppVar11 + 1;
      } while (ppVar11 != ppVar5);
    }
    iVar10 = (*local_140->_vptr_DatabaseBatch[0xc])();
    if ((char)iVar10 == '\0') {
      __assert_fail("committed",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
                    ,0xfbb,"bool wallet::CWallet::MigrateToSQLite(bilingual_str &)");
    }
    if (local_178 != (WalletDatabase *)0x0) {
      (*local_178->_vptr_WalletDatabase[1])();
    }
    if ((undefined1 *)auStack_120._0_8_ != local_110) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_secure_allocator<char>_>::_M_destroy
                ((basic_string<char,_std::char_traits<char>,_secure_allocator<char>_> *)auStack_120,
                 CONCAT71(local_110._1_7_,local_110[0]));
    }
    std::filesystem::__cxx11::path::~path(&local_98);
    std::filesystem::__cxx11::path::~path(&local_68);
    bVar9 = true;
  }
  std::
  vector<std::pair<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::allocator<std::pair<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::~vector(&local_168);
  if (local_148 != (long *)0x0) {
    (**(code **)(*local_148 + 8))();
  }
  if (local_140 != (DatabaseBatch *)0x0) {
    (*local_140->_vptr_DatabaseBatch[5])();
  }
LAB_00c57345:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar9;
}

Assistant:

bool CWallet::MigrateToSQLite(bilingual_str& error)
{
    AssertLockHeld(cs_wallet);

    WalletLogPrintf("Migrating wallet storage database from BerkeleyDB to SQLite.\n");

    if (m_database->Format() == "sqlite") {
        error = _("Error: This wallet already uses SQLite");
        return false;
    }

    // Get all of the records for DB type migration
    std::unique_ptr<DatabaseBatch> batch = m_database->MakeBatch();
    std::unique_ptr<DatabaseCursor> cursor = batch->GetNewCursor();
    std::vector<std::pair<SerializeData, SerializeData>> records;
    if (!cursor) {
        error = _("Error: Unable to begin reading all records in the database");
        return false;
    }
    DatabaseCursor::Status status = DatabaseCursor::Status::FAIL;
    while (true) {
        DataStream ss_key{};
        DataStream ss_value{};
        status = cursor->Next(ss_key, ss_value);
        if (status != DatabaseCursor::Status::MORE) {
            break;
        }
        SerializeData key(ss_key.begin(), ss_key.end());
        SerializeData value(ss_value.begin(), ss_value.end());
        records.emplace_back(key, value);
    }
    cursor.reset();
    batch.reset();
    if (status != DatabaseCursor::Status::DONE) {
        error = _("Error: Unable to read all records in the database");
        return false;
    }

    // Close this database and delete the file
    fs::path db_path = fs::PathFromString(m_database->Filename());
    m_database->Close();
    fs::remove(db_path);

    // Generate the path for the location of the migrated wallet
    // Wallets that are plain files rather than wallet directories will be migrated to be wallet directories.
    const fs::path wallet_path = fsbridge::AbsPathJoin(GetWalletDir(), fs::PathFromString(m_name));

    // Make new DB
    DatabaseOptions opts;
    opts.require_create = true;
    opts.require_format = DatabaseFormat::SQLITE;
    DatabaseStatus db_status;
    std::unique_ptr<WalletDatabase> new_db = MakeDatabase(wallet_path, opts, db_status, error);
    assert(new_db); // This is to prevent doing anything further with this wallet. The original file was deleted, but a backup exists.
    m_database.reset();
    m_database = std::move(new_db);

    // Write existing records into the new DB
    batch = m_database->MakeBatch();
    bool began = batch->TxnBegin();
    assert(began); // This is a critical error, the new db could not be written to. The original db exists as a backup, but we should not continue execution.
    for (const auto& [key, value] : records) {
        if (!batch->Write(Span{key}, Span{value})) {
            batch->TxnAbort();
            m_database->Close();
            fs::remove(m_database->Filename());
            assert(false); // This is a critical error, the new db could not be written to. The original db exists as a backup, but we should not continue execution.
        }
    }
    bool committed = batch->TxnCommit();
    assert(committed); // This is a critical error, the new db could not be written to. The original db exists as a backup, but we should not continue execution.
    return true;
}